

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_last_fp(DisasContext_conflict1 *s,arg_rpr_esz *a,_Bool before)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  undefined1 extraout_AL;
  TCGv_i64 v;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    v = do_last_scalar(s,a->esz,a->pg,a->rn,before);
    write_fp_dreg_aarch64(s,a->rd,v);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(v + (long)s_00));
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool do_last_fp(DisasContext *s, arg_rpr_esz *a, bool before)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 val = do_last_scalar(s, a->esz, a->pg, a->rn, before);
        write_fp_dreg(s, a->rd, val);
        tcg_temp_free_i64(tcg_ctx, val);
    }
    return true;
}